

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O1

int CfdGetBlindTxBlindData
              (void *handle,void *blind_handle,uint32_t index,uint32_t *vout,char **asset,
              int64_t *value_satoshi,char **asset_blind_factor,char **value_blind_factor,
              char **issuance_txid,uint32_t *issuance_vout,bool *is_issuance_asset,
              bool *is_issuance_token)

{
  long *plVar1;
  uint32_t uVar2;
  ulong uVar3;
  int64_t iVar4;
  CfdException *pCVar5;
  ulong uVar6;
  uint32_t *puVar7;
  Amount AVar8;
  char *work_value_blind_factor;
  char *work_asset_blind_factor;
  char *work_asset;
  undefined1 local_a0 [8];
  int local_98;
  char *local_90 [2];
  void *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char **local_58;
  Txid local_50;
  
  local_60 = (char *)0x0;
  local_68 = (char *)0x0;
  local_70 = (char *)0x0;
  local_78 = (char *)0x0;
  local_80 = handle;
  local_58 = asset;
  cfd::Initialize();
  local_a0 = (undefined1  [8])local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"BlindTxData","");
  cfd::capi::CheckBuffer(blind_handle,(string *)local_a0);
  if (local_a0 != (undefined1  [8])local_90) {
    operator_delete((void *)local_a0);
  }
  plVar1 = *(long **)((long)blind_handle + 0x38);
  if (plVar1 == (long *)0x0) {
    local_a0 = (undefined1  [8])0x5f3c92;
    local_98 = 0x5b5;
    local_90[0] = "CfdGetBlindTxBlindData";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_a0,kCfdLogLevelWarning,"buffer state is illegal.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_a0 = (undefined1  [8])local_90;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_a0,"Failed to parameter. buffer state is illegal.","");
    cfd::core::CfdException::CfdException(pCVar5,kCfdOutOfRangeError,(string *)local_a0);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(char *)((long)blind_handle + 0x30) == '\0') {
    local_a0 = (undefined1  [8])0x5f3c92;
    local_98 = 0x5bb;
    local_90[0] = "CfdGetBlindTxBlindData";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_a0,kCfdLogLevelWarning,"unused collect blinder.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_a0 = (undefined1  [8])local_90;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_a0,"Failed to collect state. unused collect blinder.","");
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_a0);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  uVar3 = (ulong)index;
  uVar6 = (plVar1[1] - *plVar1 >> 3) * -0x70a3d70a3d70a3d7;
  if (uVar3 <= uVar6 && uVar6 - uVar3 != 0) {
    puVar7 = (uint32_t *)(*plVar1 + uVar3 * 200);
    if (vout != (uint32_t *)0x0) {
      *vout = *puVar7;
    }
    if (local_58 != (char **)0x0) {
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
                ((string *)local_a0,(ConfidentialAssetId *)(puVar7 + 2));
      local_60 = cfd::capi::CreateString((string *)local_a0);
      if (local_a0 != (undefined1  [8])local_90) {
        operator_delete((void *)local_a0);
      }
    }
    if (value_satoshi != (int64_t *)0x0) {
      AVar8 = cfd::core::ConfidentialValue::GetAmount((ConfidentialValue *)(puVar7 + 0x1c));
      local_a0 = (undefined1  [8])AVar8.amount_;
      local_98 = CONCAT31(local_98._1_3_,AVar8.ignore_check_);
      iVar4 = cfd::core::Amount::GetSatoshiValue((Amount *)local_a0);
      *value_satoshi = iVar4;
    }
    if (asset_blind_factor != (char **)0x0) {
      cfd::core::BlindFactor::GetHex_abi_cxx11_((string *)local_a0,(BlindFactor *)(puVar7 + 0xc));
      local_68 = cfd::capi::CreateString((string *)local_a0);
      if (local_a0 != (undefined1  [8])local_90) {
        operator_delete((void *)local_a0);
      }
    }
    if (value_blind_factor != (char **)0x0) {
      cfd::core::BlindFactor::GetHex_abi_cxx11_((string *)local_a0,(BlindFactor *)(puVar7 + 0x14));
      local_70 = cfd::capi::CreateString((string *)local_a0);
      if (local_a0 != (undefined1  [8])local_90) {
        operator_delete((void *)local_a0);
      }
    }
    if (issuance_vout != (uint32_t *)0x0 && issuance_txid != (char **)0x0) {
      uVar2 = cfd::core::OutPoint::GetVout((OutPoint *)(puVar7 + 0x26));
      *issuance_vout = uVar2;
      cfd::core::OutPoint::GetTxid(&local_50,(OutPoint *)(puVar7 + 0x26));
      cfd::core::Txid::GetHex_abi_cxx11_((string *)local_a0,&local_50);
      local_78 = cfd::capi::CreateString((string *)local_a0);
      if (local_a0 != (undefined1  [8])local_90) {
        operator_delete((void *)local_a0);
      }
      local_50._vptr_Txid = (_func_int **)&PTR__Txid_00735400;
      if (local_50.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_50.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    if (is_issuance_asset != (bool *)0x0) {
      *is_issuance_asset = SUB41(puVar7[0x30],0);
    }
    if (is_issuance_token != (bool *)0x0) {
      *is_issuance_token = *(bool *)((long)puVar7 + 0xc1);
    }
    if (local_60 != (char *)0x0) {
      *local_58 = local_60;
    }
    if (local_68 != (char *)0x0) {
      *asset_blind_factor = local_68;
    }
    if (local_70 != (char *)0x0) {
      *value_blind_factor = local_70;
    }
    if (local_78 != (char *)0x0) {
      *issuance_txid = local_78;
    }
    return 0;
  }
  local_a0 = (undefined1  [8])0x5f3c92;
  local_98 = 0x5c1;
  local_90[0] = "CfdGetBlindTxBlindData";
  cfd::core::logger::log<>((CfdSourceLocation *)local_a0,kCfdLogLevelWarning,"index out of range.");
  pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
  local_a0 = (undefined1  [8])local_90;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a0,"Failed to parameter. index out of range.","");
  cfd::core::CfdException::CfdException(pCVar5,kCfdOutOfRangeError,(string *)local_a0);
  __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetBlindTxBlindData(
    void* handle, void* blind_handle, uint32_t index, uint32_t* vout,
    char** asset, int64_t* value_satoshi, char** asset_blind_factor,
    char** value_blind_factor, char** issuance_txid, uint32_t* issuance_vout,
    bool* is_issuance_asset, bool* is_issuance_token) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_asset = nullptr;
  char* work_asset_blind_factor = nullptr;
  char* work_value_blind_factor = nullptr;
  char* work_txid = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(blind_handle, kPrefixBlindTxData);

    CfdCapiBlindTxData* buffer =
        static_cast<CfdCapiBlindTxData*>(blind_handle);
    if (buffer->blinder_list == nullptr) {
      warn(CFD_LOG_SOURCE, "buffer state is illegal.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "Failed to parameter. buffer state is illegal.");
    }
    if (!buffer->has_collect_blinder) {
      warn(CFD_LOG_SOURCE, "unused collect blinder.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to collect state. unused collect blinder.");
    }
    if (index >= buffer->blinder_list->size()) {
      warn(CFD_LOG_SOURCE, "index out of range.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "Failed to parameter. index out of range.");
    }

    auto& data = (*buffer->blinder_list)[index];
    if (vout != nullptr) *vout = data.vout;
    if (asset != nullptr) {
      work_asset = CreateString(data.asset.GetHex());
    }
    if (value_satoshi != nullptr) {
      *value_satoshi = data.value.GetAmount().GetSatoshiValue();
    }
    if (asset_blind_factor != nullptr) {
      work_asset_blind_factor = CreateString(data.abf.GetHex());
    }
    if (value_blind_factor != nullptr) {
      work_value_blind_factor = CreateString(data.vbf.GetHex());
    }
    if ((issuance_txid != nullptr) && (issuance_vout != nullptr)) {
      *issuance_vout = data.issuance_outpoint.GetVout();
      work_txid = CreateString(data.issuance_outpoint.GetTxid().GetHex());
    }
    if (is_issuance_asset != nullptr) *is_issuance_asset = data.is_issuance;
    if (is_issuance_token != nullptr) {
      *is_issuance_token = data.is_issuance_token;
    }

    if (work_asset != nullptr) *asset = work_asset;
    if (work_asset_blind_factor != nullptr)
      *asset_blind_factor = work_asset_blind_factor;
    if (work_value_blind_factor != nullptr)
      *value_blind_factor = work_value_blind_factor;
    if (work_txid != nullptr) *issuance_txid = work_txid;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_asset, &work_asset_blind_factor);
  FreeBufferOnError(&work_value_blind_factor, &work_txid);
  return result;
}